

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int queue_segment_set_out(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  long *plVar1;
  int code;
  uint32_t i;
  ulong uVar2;
  
  if (field == 0) {
    plVar1 = (long *)segment->data;
    if (location < *(uint *)(plVar1 + 3)) {
      *(void **)(plVar1[2] + (ulong)location * 8) = buffer;
      for (uVar2 = 0; uVar2 < *(uint *)(plVar1 + 1); uVar2 = uVar2 + 1) {
        mixed_segment_set_out(0,location,buffer,*(mixed_segment **)(*plVar1 + uVar2 * 8));
      }
      return 1;
    }
    code = 6;
  }
  else {
    code = 7;
  }
  mixed_err(code);
  return 0;
}

Assistant:

int queue_segment_set_out(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(location < data->out_count){
      data->out[location] = (struct mixed_buffer *)buffer;
      // Update existing segments in the queue.
      for(uint32_t i=0; i<data->count; ++i){
        mixed_segment_set_out(MIXED_BUFFER, location, buffer, data->queue[i]);
      }
      return 1;
    }
    mixed_err(MIXED_INVALID_LOCATION);
    return 0;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}